

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-ggml.cpp
# Opt level: O3

ggml_ftype ggml_parse_ftype(char *str)

{
  _Rb_tree_color _Var1;
  ggml_ftype gVar2;
  size_t sVar3;
  const_iterator cVar4;
  key_type local_38;
  
  if (*str == 'q') {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    sVar3 = strlen(str);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,str,str + sVar3);
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_ftype>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_ftype>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_ftype>_>_>
            ::find(&GGML_FTYPE_MAP_abi_cxx11_._M_t,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar4._M_node ==
        &GGML_FTYPE_MAP_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      fprintf(_stderr,"%s: unknown ftype \'%s\'\n","ggml_parse_ftype",str);
      _Var1 = ~_S_red;
    }
    else {
      _Var1 = cVar4._M_node[2]._M_color;
    }
    return _Var1;
  }
  gVar2 = atoi(str);
  return gVar2;
}

Assistant:

enum ggml_ftype ggml_parse_ftype(const char * str) {
    enum ggml_ftype ftype;
    if (str[0] == 'q') {
        const auto it = GGML_FTYPE_MAP.find(str);
        if (it == GGML_FTYPE_MAP.end()) {
            fprintf(stderr, "%s: unknown ftype '%s'\n", __func__, str);
            return GGML_FTYPE_UNKNOWN;
        }
        ftype = it->second;
    } else {
        ftype = (enum ggml_ftype) atoi(str);
    }

    return ftype;
}